

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringtriebuilder.cpp
# Opt level: O0

int32_t __thiscall
icu_63::StringTrieBuilder::SplitBranchNode::markRightEdgesFirst
          (SplitBranchNode *this,int32_t edgeNumber)

{
  int iVar1;
  int local_14;
  int32_t edgeNumber_local;
  SplitBranchNode *this_local;
  
  local_14 = edgeNumber;
  if ((this->super_BranchNode).super_Node.offset == 0) {
    (this->super_BranchNode).firstEdgeNumber = edgeNumber;
    iVar1 = (*(this->greaterOrEqual->super_UObject)._vptr_UObject[4])
                      (this->greaterOrEqual,(ulong)(uint)edgeNumber);
    local_14 = (*(this->lessThan->super_UObject)._vptr_UObject[4])
                         (this->lessThan,(ulong)(iVar1 - 1));
    (this->super_BranchNode).super_Node.offset = local_14;
  }
  return local_14;
}

Assistant:

int32_t
StringTrieBuilder::SplitBranchNode::markRightEdgesFirst(int32_t edgeNumber) {
    if(offset==0) {
        firstEdgeNumber=edgeNumber;
        edgeNumber=greaterOrEqual->markRightEdgesFirst(edgeNumber);
        offset=edgeNumber=lessThan->markRightEdgesFirst(edgeNumber-1);
    }
    return edgeNumber;
}